

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::BamToolsIndex::WriteBlock(BamToolsIndex *this,BtiBlock *block)

{
  IBamIODevice *pIVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  BamException *this_00;
  allocator local_72;
  allocator local_71;
  int32_t startPosition;
  int32_t maxEndPosition;
  int64_t startOffset;
  string local_60;
  string local_40;
  
  maxEndPosition = block->MaxEndPosition;
  startOffset = block->StartOffset;
  startPosition = block->StartPosition;
  if (this->m_isBigEndian == true) {
    SwapEndian_32(&maxEndPosition);
    SwapEndian_64(&startOffset);
    SwapEndian_32(&startPosition);
  }
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&maxEndPosition,4);
  pIVar1 = (this->m_resources).Device;
  iVar3 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&startOffset,8);
  pIVar1 = (this->m_resources).Device;
  iVar4 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&startPosition,4);
  if (CONCAT44(extraout_var_01,iVar4) +
      CONCAT44(extraout_var_00,iVar3) + CONCAT44(extraout_var,iVar2) == 0x10) {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_40,"BamToolsIndex::WriteBlock",&local_71);
  std::__cxx11::string::string((string *)&local_60,"could not write BTI block",&local_72);
  BamException::BamException(this_00,&local_40,&local_60);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamToolsIndex::WriteBlock(const BtiBlock& block)
{

    // copy entry data
    int32_t maxEndPosition = block.MaxEndPosition;
    int64_t startOffset = block.StartOffset;
    int32_t startPosition = block.StartPosition;

    // swap endian-ness if necessary
    if (m_isBigEndian) {
        SwapEndian_32(maxEndPosition);
        SwapEndian_64(startOffset);
        SwapEndian_32(startPosition);
    }

    // write the reference index entry
    int64_t numBytesWritten = 0;
    numBytesWritten +=
        m_resources.Device->Write((const char*)&maxEndPosition, sizeof(maxEndPosition));
    numBytesWritten += m_resources.Device->Write((const char*)&startOffset, sizeof(startOffset));
    numBytesWritten +=
        m_resources.Device->Write((const char*)&startPosition, sizeof(startPosition));

    // check block written ok
    const int expectedBytes = sizeof(maxEndPosition) + sizeof(startOffset) + sizeof(startPosition);
    if (numBytesWritten != expectedBytes)
        throw BamException("BamToolsIndex::WriteBlock", "could not write BTI block");
}